

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChConvexDecomposition::WriteConvexHullsAsChullsFile
          (ChConvexDecomposition *this,ChStreamOutAscii *mstream)

{
  uint uVar1;
  int iVar2;
  ChStreamOutAscii *pCVar3;
  uint uVar4;
  ulong uVar5;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> aconvexhull;
  
  ChStreamOutAscii::SetNumFormat(mstream,"%0.9f");
  ChStreamOutAscii::operator<<
            (mstream,
             "# Convex hulls obtained with Chrono::Engine \n# convex decomposition (.chulls format: only vertexes)\n"
            );
  uVar4 = 0;
  do {
    uVar1 = (*this->_vptr_ChConvexDecomposition[7])(this);
    if (uVar1 <= uVar4) {
LAB_00d484b2:
      return uVar1 <= uVar4;
    }
    aconvexhull.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    aconvexhull.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    aconvexhull.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar2 = (*this->_vptr_ChConvexDecomposition[9])(this,(ulong)uVar4,&aconvexhull);
    if ((char)iVar2 == '\0') {
      std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
      ~_Vector_base(&aconvexhull.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   );
      goto LAB_00d484b2;
    }
    ChStreamOutAscii::operator<<(mstream,"hull\n");
    uVar1 = 0;
    while( true ) {
      uVar5 = (ulong)uVar1;
      if ((ulong)(((long)aconvexhull.
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)aconvexhull.
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar5) break;
      pCVar3 = ChStreamOutAscii::operator<<
                         (mstream,aconvexhull.
                                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].m_data[0]);
      pCVar3 = ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = ChStreamOutAscii::operator<<
                         (pCVar3,aconvexhull.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5].m_data[1]);
      pCVar3 = ChStreamOutAscii::operator<<(pCVar3," ");
      pCVar3 = ChStreamOutAscii::operator<<
                         (pCVar3,aconvexhull.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5].m_data[2]);
      ChStreamOutAscii::operator<<(pCVar3,"\n");
      uVar1 = uVar1 + 1;
    }
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base(&aconvexhull.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 );
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool ChConvexDecomposition::WriteConvexHullsAsChullsFile(ChStreamOutAscii& mstream) {
    mstream.SetNumFormat("%0.9f");
    mstream << "# Convex hulls obtained with Chrono::Engine \n# convex decomposition (.chulls format: only vertexes)\n";

    for (unsigned int ih = 0; ih < this->GetHullCount(); ih++) {
        std::vector<ChVector<double> > aconvexhull;

        if (!this->GetConvexHullResult(ih, aconvexhull))
            return false;

        mstream << "hull\n";
        for (unsigned int i = 0; i < aconvexhull.size(); i++) {
            mstream << aconvexhull[i].x() << " " << aconvexhull[i].y() << " " << aconvexhull[i].z() << "\n";
        }
    }
    return true;
}